

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O1

void PredictorAdd0_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char cVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  char cVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  char cVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  char cVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  
  uVar19 = 0;
  if (3 < num_pixels) {
    uVar18 = 0;
    do {
      puVar1 = in + uVar18;
      uVar3 = *(undefined1 *)((long)puVar1 + 1);
      uVar4 = *(undefined1 *)((long)puVar1 + 2);
      cVar5 = *(char *)((long)puVar1 + 3);
      uVar15 = puVar1[1];
      uVar6 = *(undefined1 *)((long)puVar1 + 5);
      uVar7 = *(undefined1 *)((long)puVar1 + 6);
      cVar8 = *(char *)((long)puVar1 + 7);
      uVar16 = puVar1[2];
      uVar9 = *(undefined1 *)((long)puVar1 + 9);
      uVar10 = *(undefined1 *)((long)puVar1 + 10);
      cVar11 = *(char *)((long)puVar1 + 0xb);
      uVar17 = puVar1[3];
      uVar12 = *(undefined1 *)((long)puVar1 + 0xd);
      uVar13 = *(undefined1 *)((long)puVar1 + 0xe);
      cVar14 = *(char *)((long)puVar1 + 0xf);
      puVar2 = out + uVar18;
      *(char *)puVar2 = (char)*puVar1;
      *(undefined1 *)((long)puVar2 + 1) = uVar3;
      *(undefined1 *)((long)puVar2 + 2) = uVar4;
      *(char *)((long)puVar2 + 3) = cVar5 + -1;
      *(char *)(puVar2 + 1) = (char)uVar15;
      *(undefined1 *)((long)puVar2 + 5) = uVar6;
      *(undefined1 *)((long)puVar2 + 6) = uVar7;
      *(char *)((long)puVar2 + 7) = cVar8 + -1;
      *(char *)(puVar2 + 2) = (char)uVar16;
      *(undefined1 *)((long)puVar2 + 9) = uVar9;
      *(undefined1 *)((long)puVar2 + 10) = uVar10;
      *(char *)((long)puVar2 + 0xb) = cVar11 + -1;
      *(char *)(puVar2 + 3) = (char)uVar17;
      *(undefined1 *)((long)puVar2 + 0xd) = uVar12;
      *(undefined1 *)((long)puVar2 + 0xe) = uVar13;
      *(char *)((long)puVar2 + 0xf) = cVar14 + -1;
      uVar19 = uVar18 + 4;
      uVar21 = uVar18 + 8;
      uVar18 = uVar19;
    } while (uVar21 <= (uint)num_pixels);
  }
  iVar20 = num_pixels - (int)uVar19;
  if (iVar20 == 0) {
    return;
  }
  (*VP8LPredictorsAdd_C[0])
            (in + (uVar19 & 0xffffffff),(uint32_t *)0x0,iVar20,out + (uVar19 & 0xffffffff));
  return;
}

Assistant:

static void PredictorAdd0_SSE2(const uint32_t* in, const uint32_t* upper,
                               int num_pixels, uint32_t* out) {
  int i;
  const __m128i black = _mm_set1_epi32(ARGB_BLACK);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i res = _mm_add_epi8(src, black);
    _mm_storeu_si128((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[0](in + i, NULL, num_pixels - i, out + i);
  }
  (void)upper;
}